

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int derive_resumption_secret(ptls_key_schedule_t *sched,uint8_t *secret,ptls_iovec_t nonce)

{
  ptls_hash_algorithm_t *algo;
  size_t outlen;
  int iVar1;
  ptls_iovec_t secret_00;
  
  iVar1 = derive_secret(sched,secret,"res master");
  if (iVar1 == 0) {
    algo = sched->hashes[0].algo;
    outlen = algo->digest_size;
    secret_00.len = outlen;
    secret_00.base = secret;
    iVar1 = hkdf_expand_label(algo,secret,outlen,secret_00,"resumption",nonce,
                              sched->hkdf_label_prefix);
  }
  if (iVar1 != 0) {
    (*ptls_clear_memory)(secret,(sched->hashes[0].algo)->digest_size);
  }
  return iVar1;
}

Assistant:

static int derive_resumption_secret(ptls_key_schedule_t *sched, uint8_t *secret, ptls_iovec_t nonce)
{
    int ret;

    if ((ret = derive_secret(sched, secret, "res master")) != 0)
        goto Exit;
    if ((ret = hkdf_expand_label(sched->hashes[0].algo, secret, sched->hashes[0].algo->digest_size,
                                 ptls_iovec_init(secret, sched->hashes[0].algo->digest_size), "resumption", nonce,
                                 sched->hkdf_label_prefix)) != 0)
        goto Exit;

Exit:
    if (ret != 0)
        ptls_clear_memory(secret, sched->hashes[0].algo->digest_size);
    return ret;
}